

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

lys_module * lys_parse_fd_(ly_ctx *ctx,int fd,LYS_INFORMAT format,char *revision,int implement)

{
  int iVar1;
  lys_module *plVar2;
  char *format_00;
  LY_ERR no;
  size_t local_40;
  size_t length;
  char *addr;
  
  if (ctx == (ly_ctx *)0x0 || fd < 0) {
    format_00 = "Invalid arguments (%s()).";
    no = LY_EINVAL;
    ctx = (ly_ctx *)0x0;
  }
  else {
    iVar1 = lyp_mmap(ctx,fd,(ulong)(format == LYS_IN_YANG),&local_40,(void **)&length);
    if (iVar1 == 0) {
      if (length == 0) {
        ly_log(ctx,LY_LLERR,LY_EINVAL,"Empty schema file.");
        return (lys_module *)0x0;
      }
      plVar2 = lys_parse_mem_(ctx,(char *)length,format,revision,1,implement);
      lyp_munmap((void *)length,local_40);
      if (plVar2 != (lys_module *)0x0) {
        if (plVar2->filepath != (char *)0x0) {
          return plVar2;
        }
        lys_parse_set_filename(ctx,&plVar2->filepath,fd);
        return plVar2;
      }
      return (lys_module *)0x0;
    }
    format_00 = "Mapping file descriptor into memory failed (%s()).";
    no = LY_ESYS;
  }
  ly_log(ctx,LY_LLERR,no,format_00,"lys_parse_fd_");
  return (lys_module *)0x0;
}

Assistant:

const struct lys_module *
lys_parse_fd_(struct ly_ctx *ctx, int fd, LYS_INFORMAT format, const char *revision, int implement)
{
    const struct lys_module *module;
    size_t length;
    char *addr;

    if (!ctx || fd < 0) {
        LOGARG;
        return NULL;
    }

    if (lyp_mmap(ctx, fd, format == LYS_IN_YANG ? 1 : 0, &length, (void **)&addr)) {
        LOGERR(ctx, LY_ESYS, "Mapping file descriptor into memory failed (%s()).", __func__);
        return NULL;
    } else if (!addr) {
        LOGERR(ctx, LY_EINVAL, "Empty schema file.");
        return NULL;
    }

    module = lys_parse_mem_(ctx, addr, format, revision, 1, implement);
    lyp_munmap(addr, length);

    if (module && !module->filepath) {
        lys_parse_set_filename(ctx, (const char **)&module->filepath, fd);
    }

    return module;
}